

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGMarkerElement::SVGMarkerElement(SVGMarkerElement *this,Document *document)

{
  Document *document_local;
  SVGMarkerElement *this_local;
  
  SVGElement::SVGElement(&this->super_SVGElement,document,Marker);
  (this->super_SVGElement).super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGMarkerElement_001c1ca8;
  SVGFitToViewBox::SVGFitToViewBox(&this->super_SVGFitToViewBox,&this->super_SVGElement);
  (this->super_SVGElement).super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGMarkerElement_001c1ca8;
  SVGLength::SVGLength(&this->m_refX,RefX,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_refY,RefY,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_markerWidth,MarkerWidth,Horizontal,Forbid,3.0,None);
  SVGLength::SVGLength(&this->m_markerHeight,MarkerHeight,Vertical,Forbid,3.0,None);
  SVGEnumeration<lunasvg::MarkerUnits>::SVGEnumeration(&this->m_markerUnits,MarkerUnits,StrokeWidth)
  ;
  SVGAngle::SVGAngle(&this->m_orient,Orient);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_refX).super_SVGProperty);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_refY).super_SVGProperty);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_markerWidth).super_SVGProperty);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_markerHeight).super_SVGProperty);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_markerUnits).super_SVGProperty);
  SVGElement::addProperty(&this->super_SVGElement,&(this->m_orient).super_SVGProperty);
  return;
}

Assistant:

SVGMarkerElement::SVGMarkerElement(Document* document)
    : SVGElement(document, ElementID::Marker)
    , SVGFitToViewBox(this)
    , m_refX(PropertyID::RefX, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_refY(PropertyID::RefY, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_markerWidth(PropertyID::MarkerWidth, LengthDirection::Horizontal, LengthNegativeMode::Forbid, 3.f, LengthUnits::None)
    , m_markerHeight(PropertyID::MarkerHeight, LengthDirection::Vertical, LengthNegativeMode::Forbid, 3.f, LengthUnits::None)
    , m_markerUnits(PropertyID::MarkerUnits, MarkerUnits::StrokeWidth)
    , m_orient(PropertyID::Orient)
{
    addProperty(m_refX);
    addProperty(m_refY);
    addProperty(m_markerWidth);
    addProperty(m_markerHeight);
    addProperty(m_markerUnits);
    addProperty(m_orient);
}